

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmaturePopulate.cpp
# Opt level: O0

aiNode * Assimp::ArmaturePopulate::GetArmatureRoot
                   (aiNode *bone_node,vector<aiBone_*,_std::allocator<aiBone_*>_> *bone_list)

{
  bool bVar1;
  Logger *pLVar2;
  basic_formatter *this;
  char *local_1c0;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_40;
  vector<aiBone_*,_std::allocator<aiBone_*>_> *local_20;
  vector<aiBone_*,_std::allocator<aiBone_*>_> *bone_list_local;
  aiNode *bone_node_local;
  
  local_20 = bone_list;
  bone_list_local = (vector<aiBone_*,_std::allocator<aiBone_*>_> *)bone_node;
  while( true ) {
    if (bone_list_local == (vector<aiBone_*,_std::allocator<aiBone_*>_> *)0x0) {
      pLVar2 = DefaultLogger::get();
      Logger::error(pLVar2,"GetArmatureRoot() can\'t find armature!");
      return (aiNode *)0x0;
    }
    bVar1 = IsBoneNode((aiString *)bone_list_local,local_20);
    if (!bVar1) break;
    bone_list_local =
         (vector<aiBone_*,_std::allocator<aiBone_*>_> *)
         bone_list_local[0x2d].super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  }
  pLVar2 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[41]>(&local_1b8,(char (*) [41])"GetArmatureRoot() Found valid armature: ");
  local_1c0 = aiString::C_Str((aiString *)bone_list_local);
  this = (basic_formatter *)
         Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                   ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_1b8,
                    &local_1c0);
  Formatter::basic_formatter::operator_cast_to_string(&local_40,this);
  Logger::debug(pLVar2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_1b8);
  return (aiNode *)bone_list_local;
}

Assistant:

aiNode *ArmaturePopulate::GetArmatureRoot(aiNode *bone_node,
                                          std::vector<aiBone *> &bone_list) {
  while (bone_node) {
    if (!IsBoneNode(bone_node->mName, bone_list)) {
      ASSIMP_LOG_DEBUG_F("GetArmatureRoot() Found valid armature: ", bone_node->mName.C_Str());
      return bone_node;
    }

    bone_node = bone_node->mParent;
  }
  
  ASSIMP_LOG_ERROR("GetArmatureRoot() can't find armature!");
  
  return nullptr;
}